

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFxu.c
# Opt level: O2

int Abc_NtkFastExtract(Abc_Ntk_t *pNtk,Fxu_Data_t *p)

{
  uint uVar1;
  int *piVar2;
  void **ppvVar3;
  void *pvVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  Abc_Obj_t *pAVar8;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *pVVar9;
  Abc_Obj_t *pAVar10;
  ulong uVar11;
  void *Entry;
  void *Entry_00;
  void *Entry_01;
  void *Entry_02;
  int n;
  ulong uVar12;
  Abc_Ntk_t *pAVar13;
  ulong uVar14;
  long lVar15;
  char *__s;
  long lVar16;
  bool bVar17;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFxu.c"
                  ,0x55,"int Abc_NtkFastExtract(Abc_Ntk_t *, Fxu_Data_t *)");
  }
  iVar6 = Abc_NtkToSop(pNtk,-1,1000000000);
  if (iVar6 == 0) {
    iVar6 = 0;
    __s = "Abc_NtkFastExtract(): Converting to SOPs has failed.";
  }
  else {
    __s = "Abc_NtkFastExtract: Nodes have duplicated or complemented fanins. FXU is not performed.";
    for (iVar6 = 0; iVar6 < pNtk->vObjs->nSize; iVar6 = iVar6 + 1) {
      pAVar8 = Abc_NtkObj(pNtk,iVar6);
      if ((pAVar8 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar8->field_0x14 & 0xf) == 7)) {
        uVar1 = (pAVar8->vFanins).nSize;
        uVar11 = (ulong)uVar1;
        if ((int)uVar1 < 1) {
          uVar11 = 0;
        }
        for (uVar12 = 0; uVar12 != uVar11; uVar12 = uVar12 + 1) {
          piVar2 = (pAVar8->vFanins).pArray;
          ppvVar3 = pAVar8->pNtk->vObjs->pArray;
          if ((uVar12 < 2) &&
             (((uint)(uVar12 != 0) * 0x400 + 0x400 & *(uint *)&pAVar8->field_0x14) != 0)) {
LAB_0024af4c:
            iVar6 = 0;
            goto LAB_0024af59;
          }
          uVar5 = 0;
          while (uVar14 = uVar5, uVar11 != uVar14) {
            uVar5 = uVar14 + 1;
            if ((uVar12 != uVar14) && (ppvVar3[piVar2[uVar12]] == ppvVar3[piVar2[uVar14]]))
            goto LAB_0024af4c;
          }
        }
      }
    }
    pAVar13 = pNtk;
    Abc_NtkCleanup(pNtk,0);
    p->pManSop = (Mem_Flex_t *)pNtk->pManFunc;
    iVar6 = (int)pAVar13;
    p_00 = Vec_PtrAlloc(iVar6);
    p->vSops = p_00;
    pVVar9 = Vec_PtrAlloc(iVar6);
    p->vFanins = pVVar9;
    pVVar9 = Vec_PtrAlloc(iVar6);
    p->vSopsNew = pVVar9;
    pVVar9 = Vec_PtrAlloc(iVar6);
    p->vFaninsNew = pVVar9;
    Vec_PtrFill(p_00,pNtk->vObjs->nSize,Entry);
    Vec_PtrFill(p->vFanins,pNtk->vObjs->nSize,Entry_00);
    Vec_PtrFill(p->vSopsNew,p->nNodesExt + pNtk->vObjs->nSize,Entry_01);
    Vec_PtrFill(p->vFaninsNew,p->nNodesExt + pNtk->vObjs->nSize,Entry_02);
    for (lVar16 = 0; iVar6 = pNtk->vObjs->nSize, lVar16 < iVar6; lVar16 = lVar16 + 1) {
      pAVar8 = Abc_NtkObj(pNtk,(int)lVar16);
      if ((((pAVar8 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar8->field_0x14 & 0xf) == 7)) &&
          (iVar6 = Abc_SopGetVarNum((char *)(pAVar8->field_5).pData), 1 < iVar6)) &&
         (iVar6 = Abc_SopGetCubeNum((char *)(pAVar8->field_5).pData), 0 < iVar6)) {
        *(anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 *)(p->vSops->pArray + lVar16) = pAVar8->field_5;
        p->vFanins->pArray[lVar16] = &pAVar8->vFanins;
      }
    }
    p->nNodesOld = iVar6;
    iVar6 = Fxu_FastExtract(p);
    if (iVar6 < 1) {
      iVar6 = 0;
      __s = "Warning: The network has not been changed by \"fx\".";
    }
    else {
      iVar6 = p->vFanins->nSize;
      if (p->vFaninsNew->nSize <= iVar6) {
        __assert_fail("p->vFanins->nSize < p->vFaninsNew->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFxu.c"
                      ,0xf0,"void Abc_NtkFxuReconstruct(Abc_Ntk_t *, Fxu_Data_t *)");
      }
      while (iVar7 = p->vFanins->nSize, iVar6 < p->nNodesNew + iVar7) {
        pAVar8 = Abc_NtkCreateObj(pNtk,ABC_OBJ_NODE);
        bVar17 = iVar6 != pAVar8->Id;
        iVar6 = iVar6 + 1;
        if (bVar17) {
          __assert_fail("i == (int)pNode->Id",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFxu.c"
                        ,0xf6,"void Abc_NtkFxuReconstruct(Abc_Ntk_t *, Fxu_Data_t *)");
        }
      }
      for (lVar16 = 0; lVar15 = (long)iVar7, lVar16 < lVar15; lVar16 = lVar16 + 1) {
        if (p->vFaninsNew->pArray[lVar16] != (void *)0x0) {
          pAVar8 = Abc_NtkObj(pNtk,(int)lVar16);
          Abc_ObjRemoveFanins(pAVar8);
          pvVar4 = p->vFaninsNew->pArray[lVar16];
          for (lVar15 = 0; lVar15 < *(int *)((long)pvVar4 + 4); lVar15 = lVar15 + 1) {
            pAVar10 = Abc_NtkObj(pNtk,*(int *)(*(long *)((long)pvVar4 + 8) + lVar15 * 4));
            Abc_ObjAddFanin(pAVar8,pAVar10);
          }
          pvVar4 = p->vSopsNew->pArray[lVar16];
          (pAVar8->field_5).pData = pvVar4;
          if (pvVar4 == (void *)0x0) {
            __assert_fail("pNode->pData != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFxu.c"
                          ,0x10a,"void Abc_NtkFxuReconstruct(Abc_Ntk_t *, Fxu_Data_t *)");
          }
          iVar7 = p->vFanins->nSize;
        }
      }
      while (lVar15 < (long)p->nNodesNew + (long)p->vFanins->nSize) {
        pAVar8 = Abc_NtkObj(pNtk,(int)lVar15);
        pvVar4 = p->vFaninsNew->pArray[lVar15];
        for (lVar16 = 0; lVar16 < *(int *)((long)pvVar4 + 4); lVar16 = lVar16 + 1) {
          pAVar10 = Abc_NtkObj(pNtk,*(int *)(*(long *)((long)pvVar4 + 8) + lVar16 * 4));
          Abc_ObjAddFanin(pAVar8,pAVar10);
        }
        pvVar4 = p->vSopsNew->pArray[lVar15];
        (pAVar8->field_5).pData = pvVar4;
        lVar15 = lVar15 + 1;
        if (pvVar4 == (void *)0x0) {
          __assert_fail("pNode->pData != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFxu.c"
                        ,0x119,"void Abc_NtkFxuReconstruct(Abc_Ntk_t *, Fxu_Data_t *)");
        }
      }
      iVar7 = Abc_NtkCheck(pNtk);
      iVar6 = 1;
      if (iVar7 != 0) {
        return 1;
      }
      __s = "Abc_NtkFastExtract: The network check has failed.";
    }
  }
LAB_0024af59:
  puts(__s);
  return iVar6;
}

Assistant:

int Abc_NtkFastExtract( Abc_Ntk_t * pNtk, Fxu_Data_t * p )
{
    assert( Abc_NtkIsLogic(pNtk) );
    // if the network is already in the SOP form, it may come from BLIF file
    // and it may not be SCC-free, in which case FXU will not work correctly
    if ( Abc_NtkIsSopLogic(pNtk) )
    { // to make sure the SOPs are SCC-free
//        Abc_NtkSopToBdd(pNtk);
//        Abc_NtkBddToSop(pNtk);
    }
    // get the network in the SOP form
    if ( !Abc_NtkToSop(pNtk, -1, ABC_INFINITY) )
    {
        printf( "Abc_NtkFastExtract(): Converting to SOPs has failed.\n" );
        return 0;
    }
    // check if the network meets the requirements
    if ( !Abc_NtkFxuCheck(pNtk) )
    {
        printf( "Abc_NtkFastExtract: Nodes have duplicated or complemented fanins. FXU is not performed.\n" );
        return 0;
    }
    // sweep removes useless nodes
    Abc_NtkCleanup( pNtk, 0 );
    // collect information about the covers
    Abc_NtkFxuCollectInfo( pNtk, p );
    // call the fast extract procedure
    if ( Fxu_FastExtract(p) > 0 )
    {
        // update the network
        Abc_NtkFxuReconstruct( pNtk, p );
        // make sure everything is okay
        if ( !Abc_NtkCheck( pNtk ) )
            printf( "Abc_NtkFastExtract: The network check has failed.\n" );
        return 1;
    }
    else
        printf( "Warning: The network has not been changed by \"fx\".\n" );
    return 0;
}